

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialog::setOption(QFontDialog *this,FontDialogOption option,bool on)

{
  FontDialogOptions FVar1;
  
  FVar1 = options(this);
  if ((((uint)FVar1.super_QFlagsStorageHelper<QFontDialog::FontDialogOption,_4>.
              super_QFlagsStorage<QFontDialog::FontDialogOption>.i & option) == 0) != on) {
    return;
  }
  setOptions(this,(FontDialogOptions)
                  ((uint)FVar1.super_QFlagsStorageHelper<QFontDialog::FontDialogOption,_4>.
                         super_QFlagsStorage<QFontDialog::FontDialogOption>.i ^ option));
  return;
}

Assistant:

void QFontDialog::setOption(FontDialogOption option, bool on)
{
    const QFontDialog::FontDialogOptions previousOptions = options();
    if (!(previousOptions & option) != !on)
        setOptions(previousOptions ^ option);
}